

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O3

KeyData * cfd::capi::ParsePubkey
                    (KeyData *__return_storage_ptr__,int kind,char *pubkey,NetType net_type)

{
  NetType NVar1;
  KeyData *extraout_RAX;
  KeyData *pKVar2;
  CfdException *pCVar3;
  string pubkey_str;
  ByteData local_258;
  string local_240;
  undefined1 local_220 [32];
  ByteData local_200;
  ExtPubkey local_1e8;
  undefined1 local_178 [336];
  
  std::__cxx11::string::string((string *)local_220,pubkey,(allocator *)local_178);
  if ((kind != 4) != (local_220._8_8_ == 0x42)) {
    local_178._0_8_ = "cfdcapi_psbt.cpp";
    local_178._8_4_ = 0xa5;
    local_178._16_8_ = "ParsePubkey";
    core::logger::log<>((CfdSourceLocation *)local_178,kCfdLogLevelWarning,"unmatch pubkey type.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_178._0_8_ = local_178 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_178,"Failed to parameter. unmatch pubkey type.","");
    core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_178);
    __cxa_throw(pCVar3,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  if (local_220._8_8_ == 0x42) {
    core::KeyData::KeyData(__return_storage_ptr__,(string *)local_220,-1,false);
  }
  else {
    core::KeyData::KeyData(__return_storage_ptr__);
    if (local_220._8_8_ == 0x9c) {
      core::ByteData::ByteData(&local_258,(string *)local_220);
      core::ExtPubkey::ExtPubkey(&local_1e8,&local_258);
      local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"");
      core::ByteData::ByteData(&local_200);
      core::KeyData::KeyData((KeyData *)local_178,&local_1e8,&local_240,&local_200);
      core::KeyData::operator=(__return_storage_ptr__,(KeyData *)local_178);
      core::KeyData::~KeyData((KeyData *)local_178);
      if (local_200.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_200.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) {
        operator_delete(local_240._M_dataplus._M_p);
      }
      if (local_1e8.tweak_sum_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1e8.tweak_sum_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_1e8.pubkey_.data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1e8.pubkey_.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_1e8.chaincode_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1e8.chaincode_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_1e8.serialize_data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1e8.serialize_data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
    else {
      core::ExtPubkey::ExtPubkey(&local_1e8,(string *)local_220);
      local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"");
      core::ByteData::ByteData(&local_258);
      core::KeyData::KeyData((KeyData *)local_178,&local_1e8,&local_240,&local_258);
      core::KeyData::operator=(__return_storage_ptr__,(KeyData *)local_178);
      core::KeyData::~KeyData((KeyData *)local_178);
      if (local_258.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_258.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) {
        operator_delete(local_240._M_dataplus._M_p);
      }
      if (local_1e8.tweak_sum_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1e8.tweak_sum_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_1e8.pubkey_.data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1e8.pubkey_.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      local_258.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_1e8.serialize_data_.data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
      if (local_1e8.chaincode_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1e8.chaincode_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
        local_258.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_1e8.serialize_data_.data_.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
      }
    }
    if (local_258.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_258.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    core::KeyData::GetExtPubkey((ExtPubkey *)local_178,__return_storage_ptr__);
    NVar1 = core::ExtPubkey::GetNetworkType((ExtPubkey *)local_178);
    if ((pointer)local_178._88_8_ != (pointer)0x0) {
      operator_delete((void *)local_178._88_8_);
    }
    if ((pointer)local_178._64_8_ != (pointer)0x0) {
      operator_delete((void *)local_178._64_8_);
    }
    if ((pointer)local_178._40_8_ != (pointer)0x0) {
      operator_delete((void *)local_178._40_8_);
    }
    if ((pointer)local_178._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_178._0_8_);
    }
    if ((net_type != kMainnet) == (NVar1 == kMainnet)) {
      local_178._0_8_ = "cfdcapi_psbt.cpp";
      local_178._8_4_ = 0xb9;
      local_178._16_8_ = "ParsePubkey";
      core::logger::log<>((CfdSourceLocation *)local_178,kCfdLogLevelWarning,
                          "unmatch xpubkey network type.");
      pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
      local_178._0_8_ = local_178 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_178,"Failed to parameter. unmatch xpubkey network type.","");
      core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_178);
      __cxa_throw(pCVar3,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
  }
  pKVar2 = (KeyData *)(local_220 + 0x10);
  if ((KeyData *)local_220._0_8_ != pKVar2) {
    operator_delete((void *)local_220._0_8_);
    pKVar2 = extraout_RAX;
  }
  return pKVar2;
}

Assistant:

static KeyData ParsePubkey(int kind, const char* pubkey, NetType net_type) {
  constexpr size_t kCompressPubkeyHexSize = Pubkey::kCompressedPubkeySize * 2;
  std::string pubkey_str(pubkey);

  bool has_extpubkey = false;
  switch (kind) {
    case kCfdPsbtRecordGloalXpub:
      has_extpubkey = true;
      break;
    case kCfdPsbtRecordInputBip32:
    case kCfdPsbtRecordInputSignature:
    case kCfdPsbtRecordOutputBip32:
    default:
      break;
  }

  bool is_pubkey = false;
  if (pubkey_str.length() == kCompressPubkeyHexSize) {
    is_pubkey = true;
  }
  if (is_pubkey == has_extpubkey) {
    warn(CFD_LOG_SOURCE, "unmatch pubkey type.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Failed to parameter. unmatch pubkey type.");
  }

  if (is_pubkey) {
    return KeyData(pubkey_str);
  }
  KeyData data;
  if (pubkey_str.length() == kCfdExtPubkeyHexSize) {
    data = KeyData(ExtPubkey(ByteData(pubkey_str)), "", ByteData());
  } else {
    data = KeyData(ExtPubkey(pubkey_str), "", ByteData());
  }
  bool has_mainnet =
      (data.GetExtPubkey().GetNetworkType() == NetType::kMainnet);

  if (((net_type == NetType::kMainnet) && (!has_mainnet)) ||
      ((net_type != NetType::kMainnet) && (has_mainnet))) {
    warn(CFD_LOG_SOURCE, "unmatch xpubkey network type.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Failed to parameter. unmatch xpubkey network type.");
  }
  return data;
}